

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

MPP_RET mpp_service_reg_offset(void *ctx,MppDevRegOffsetCfg *cfg)

{
  uint uVar1;
  long lVar2;
  RK_U32 RVar3;
  undefined8 in_RAX;
  RegOffsetInfo *pRVar4;
  int iVar5;
  int iVar6;
  MPP_RET MVar7;
  long lVar8;
  
  if (cfg->offset == 0) {
LAB_00172894:
    MVar7 = MPP_OK;
  }
  else {
    iVar5 = *(int *)((long)ctx + 0x44);
    if (iVar5 < 0x40) {
      iVar6 = 0;
      if (iVar5 < 1) {
        iVar5 = iVar6;
      }
      do {
        if (iVar5 == iVar6) {
          pRVar4 = mpp_service_next_reg_offset((MppDevMppService *)ctx);
          RVar3 = cfg->offset;
          pRVar4->reg_idx = cfg->reg_idx;
          pRVar4->offset = RVar3;
          goto LAB_00172894;
        }
        lVar2 = *(long *)((long)ctx + 0x38);
        lVar8 = (long)(*(int *)((long)ctx + 0x48) + iVar6);
        uVar1 = *(uint *)(lVar2 + lVar8 * 8);
        iVar6 = iVar6 + 1;
      } while (uVar1 != cfg->reg_idx);
      MVar7 = MPP_OK;
      _mpp_log_l(2,"mpp_serivce","reg[%d] offset has been set, cover old %d -> %d\n",
                 "mpp_service_reg_offset",(ulong)uVar1,(ulong)*(uint *)(lVar2 + 4 + lVar8 * 8),
                 CONCAT44((int)((ulong)in_RAX >> 0x20),cfg->offset));
      *(RK_U32 *)(lVar2 + 4 + lVar8 * 8) = cfg->offset;
    }
    else {
      _mpp_log_l(2,"mpp_serivce","reach max offset definition\n","mpp_service_reg_offset",0x40);
      MVar7 = MPP_NOK;
    }
  }
  return MVar7;
}

Assistant:

MPP_RET mpp_service_reg_offset(void *ctx, MppDevRegOffsetCfg *cfg)
{
    MppDevMppService *p = (MppDevMppService *)ctx;
    RegOffsetInfo *info;
    RK_S32 i;

    if (!cfg->offset)
        return MPP_OK;

    if (p->reg_offset_count >= MAX_REG_OFFSET) {
        mpp_err_f("reach max offset definition\n", MAX_REG_OFFSET);
        return MPP_NOK;
    }

    for (i = 0; i < p->reg_offset_count; i++) {
        info = &p->reg_offset_info[p->reg_offset_pos + i];

        if (info->reg_idx == cfg->reg_idx) {
            mpp_err_f("reg[%d] offset has been set, cover old %d -> %d\n",
                      info->reg_idx, info->offset, cfg->offset);
            info->offset = cfg->offset;
            return MPP_OK;
        }
    }

    info = mpp_service_next_reg_offset(p);
    info->reg_idx = cfg->reg_idx;
    info->offset = cfg->offset;

    return MPP_OK;
}